

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

bool __thiscall
testing::internal::OptionalMatcher<int>::Impl<const_std::optional<unsigned_long>_&>::MatchAndExplain
          (Impl<const_std::optional<unsigned_long>_&> *this,optional<unsigned_long> *optional,
          MatchResultListener *listener)

{
  ostream *poVar1;
  bool bVar2;
  MatchResultListener *this_00;
  StringMatchResultListener value_listener;
  string local_1f0;
  char *local_1d0;
  MatchResultListener local_1c8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  if ((optional->super__Optional_base<unsigned_long,_true,_true>)._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged == false) {
    MatchResultListener::operator<<(listener,(char (*) [21])"which is not engaged");
    bVar2 = false;
  }
  else {
    local_1c8.stream_ = local_1a8;
    local_1c8._vptr_MatchResultListener = (_func_int **)&PTR__StringMatchResultListener_018ce748;
    std::__cxx11::stringstream::stringstream(local_1b8);
    bVar2 = MatcherBase<unsigned_long>::MatchAndExplain
                      (&(this->value_matcher_).super_MatcherBase<unsigned_long>,
                       (unsigned_long *)optional,&local_1c8);
    this_00 = MatchResultListener::operator<<(listener,(char (*) [13])"whose value ");
    PrintToString<unsigned_long>(&local_1f0,(unsigned_long *)optional);
    if (this_00->stream_ != (ostream *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                (this_00->stream_,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
    }
    local_1d0 = " doesn\'t match";
    if (bVar2) {
      local_1d0 = " matches";
    }
    MatchResultListener::operator<<(this_00,&local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    poVar1 = listener->stream_;
    if ((poVar1 != (ostream *)0x0) && (local_1f0._M_string_length != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    local_1c8._vptr_MatchResultListener = (_func_int **)&PTR__StringMatchResultListener_018ce748;
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  return bVar2;
}

Assistant:

bool MatchAndExplain(Optional optional,
                         MatchResultListener* listener) const override {
      if (!optional) {
        *listener << "which is not engaged";
        return false;
      }
      const ValueType& value = *optional;
      StringMatchResultListener value_listener;
      const bool match = value_matcher_.MatchAndExplain(value, &value_listener);
      *listener << "whose value " << PrintToString(value)
                << (match ? " matches" : " doesn't match");
      PrintIfNotEmpty(value_listener.str(), listener->stream());
      return match;
    }